

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

bool P_NoWayTraverse(AActor *usething,DVector2 *start,DVector2 *end)

{
  double dVar1;
  line_t_conflict *linedef;
  intercept_t *piVar2;
  byte bVar3;
  bool bVar4;
  byte unaff_R15B;
  FPathTraverse it;
  FLineOpening open;
  DVector2 local_110;
  FPathTraverse local_100;
  FLineOpening local_c0;
  
  local_100._vptr_FPathTraverse = (_func_int **)&PTR_AddLineIntercepts_006fe0c8;
  FPathTraverse::init(&local_100,(EVP_PKEY_CTX *)0x1);
  do {
    piVar2 = FPathTraverse::Next(&local_100);
    if (piVar2 == (intercept_t *)0x0) {
      bVar3 = 0;
      break;
    }
    linedef = (piVar2->d).line;
    if (linedef->special == 0) {
      if ((linedef->portalindex < linePortals.Count) &&
         ((linePortals.Array[linedef->portalindex].mFlags & 2) != 0)) {
        bVar4 = true;
        bVar3 = 0;
      }
      else {
        bVar4 = true;
        bVar3 = 1;
        if ((linedef->flags & 0xc001) == 0) {
          local_110.X = local_100.trace.dx * piVar2->frac + local_100.trace.x;
          local_110.Y = piVar2->frac * local_100.trace.dy + local_100.trace.y;
          P_LineOpening(&local_c0,(AActor *)0x0,(line_t *)linedef,&local_110,(DVector2 *)0x0,0);
          if (((0.0 < local_c0.range) &&
              (dVar1 = (usething->__Pos).Z, local_c0.bottom <= usething->MaxStepHeight + dVar1)) &&
             (dVar1 + usething->Height <= local_c0.top)) goto LAB_00412d04;
        }
      }
    }
    else {
LAB_00412d04:
      bVar4 = false;
      bVar3 = unaff_R15B;
    }
    unaff_R15B = bVar3;
  } while (!bVar4);
  FPathTraverse::~FPathTraverse(&local_100);
  return (bool)(bVar3 & 1);
}

Assistant:

bool P_NoWayTraverse(AActor *usething, const DVector2 &start, const DVector2 &end)
{
	FPathTraverse it(start.X, start.Y, end.X, end.Y, PT_ADDLINES);
	intercept_t *in;

	while ((in = it.Next()))
	{
		line_t *ld = in->d.line;
		FLineOpening open;

		// [GrafZahl] de-obfuscated. Was I the only one who was unable to make sense out of
		// this convoluted mess?
		if (ld->special) continue;
		if (ld->isLinePortal()) return false;
		if (ld->flags&(ML_BLOCKING | ML_BLOCKEVERYTHING | ML_BLOCK_PLAYERS)) return true;
		P_LineOpening(open, NULL, ld, it.InterceptPoint(in));
		if (open.range <= 0 ||
			open.bottom > usething->Z() + usething->MaxStepHeight ||
			open.top < usething->Top()) return true;
	}
	return false;
}